

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v6::detail::container_buffer<fmt::v6::detail::buffer<char>_>::grow
          (container_buffer<fmt::v6::detail::buffer<char>_> *this,size_t capacity)

{
  char *buf_data;
  size_t capacity_local;
  container_buffer<fmt::v6::detail::buffer<char>_> *this_local;
  
  buffer<char>::resize(this->container_,capacity);
  buf_data = buffer<char>::operator[]<int>(this->container_,0);
  buffer<char>::set(&this->super_buffer<char>,buf_data,capacity);
  return;
}

Assistant:

void grow(size_t capacity) FMT_OVERRIDE {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }